

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O3

Mat * __thiscall
ncnn::ModelBinFromStdio::load(Mat *__return_storage_ptr__,ModelBinFromStdio *this,int w,int type)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  void *pvVar9;
  anon_union_4_2_77b30072 flag_struct;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  uint local_4a4;
  undefined8 local_4a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_498;
  void *local_478;
  int *piStack_470;
  undefined8 local_468;
  long *local_460;
  undefined4 local_458;
  int local_454;
  undefined4 uStack_450;
  int iStack_44c;
  size_t local_448;
  vector<signed_char,_std::allocator<signed_char>_> local_438 [43];
  
  if ((FILE *)this->binfp == (FILE *)0x0) {
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->elemsize = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    goto LAB_00132ff3;
  }
  if (type == 1) {
    sVar6 = (size_t)w;
    if (w == 0) {
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 4;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = sVar6;
      return __return_storage_ptr__;
    }
    pvVar5 = malloc(sVar6 * 4 + 0x1c);
    pvVar9 = (void *)((long)pvVar5 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)pvVar9 + -8) = pvVar5;
    piVar2 = (int *)((long)pvVar9 + sVar6 * 4);
    *piVar2 = 1;
    sVar4 = fread(pvVar9,sVar6 * 4,1,(FILE *)this->binfp);
    if ((int)sVar4 == 1) {
      __return_storage_ptr__->data = pvVar9;
      __return_storage_ptr__->refcount = piVar2;
      __return_storage_ptr__->elemsize = 4;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 1;
      LOCK();
      piVar1 = (int *)((long)pvVar9 + sVar6 * 4);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      __return_storage_ptr__->w = w;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = sVar6;
    }
    else {
      fprintf(_stderr,"ModelBin read weight_data failed %d\n",sVar4 & 0xffffffff);
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
    }
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) {
      return __return_storage_ptr__;
    }
    pvVar5 = *(void **)((long)pvVar9 + -8);
    goto LAB_0013309c;
  }
  if (type == 0) {
    sVar4 = fread(&local_4a4,4,1,(FILE *)this->binfp);
    if ((int)sVar4 == 1) {
      if (local_4a4 == 0x2c056) {
        sVar6 = (size_t)w;
        if (w == 0) {
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          __return_storage_ptr__->elemsize = 4;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 1;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 1;
          __return_storage_ptr__->c = 1;
          __return_storage_ptr__->cstep = sVar6;
          return __return_storage_ptr__;
        }
        local_4a0 = sVar6 * 4;
        pvVar5 = malloc(sVar6 * 4 + 0x1c);
        pvVar9 = (void *)((long)pvVar5 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar9 + -8) = pvVar5;
        piVar2 = (int *)((long)pvVar9 + sVar6 * 4);
        *piVar2 = 1;
        sVar4 = fread(pvVar9,local_4a0,1,(FILE *)this->binfp);
        if ((int)sVar4 == 1) {
          __return_storage_ptr__->data = pvVar9;
          __return_storage_ptr__->refcount = piVar2;
          __return_storage_ptr__->elemsize = 4;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 1;
          LOCK();
          piVar1 = (int *)((long)pvVar9 + sVar6 * 4);
          *piVar1 = *piVar1 + 1;
          UNLOCK();
          __return_storage_ptr__->w = w;
          __return_storage_ptr__->h = 1;
          __return_storage_ptr__->c = 1;
          __return_storage_ptr__->cstep = sVar6;
        }
        else {
          fprintf(_stderr,"ModelBin read weight_data failed %d\n",sVar4 & 0xffffffff);
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          __return_storage_ptr__->elemsize = 0;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 0;
          __return_storage_ptr__->c = 0;
          __return_storage_ptr__->cstep = 0;
        }
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 != 0) {
          return __return_storage_ptr__;
        }
        pvVar5 = *(void **)((long)pvVar9 + -8);
        goto LAB_0013309c;
      }
      if (local_4a4 == 0xd4b38) {
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar8 = (long)(w + 3) & 0xfffffffffffffffc;
        std::vector<signed_char,_std::allocator<signed_char>_>::resize(local_438,uVar8);
        sVar4 = fread(local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,uVar8,1,(FILE *)this->binfp);
        uVar3 = (uint)sVar4;
        if (uVar3 == 1) {
          sVar4 = (size_t)w;
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          __return_storage_ptr__->elemsize = 1;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 1;
          __return_storage_ptr__->w = w;
          __return_storage_ptr__->h = 1;
          __return_storage_ptr__->c = 1;
          __return_storage_ptr__->cstep = sVar4;
          if (w != 0) {
            uVar8 = sVar4 + 3 & 0xfffffffffffffffc;
            pvVar5 = malloc(uVar8 + 0x1c);
            pvVar9 = (void *)((long)pvVar5 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar9 + -8) = pvVar5;
            __return_storage_ptr__->data = pvVar9;
            __return_storage_ptr__->refcount = (int *)((long)pvVar9 + uVar8);
            *(undefined4 *)((long)pvVar9 + uVar8) = 1;
            if (__return_storage_ptr__->c != 0) {
              memcpy(pvVar9,local_438[0].
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start,sVar4);
            }
          }
          goto LAB_001334fc;
        }
        pcVar7 = "ModelBin read int8_weights failed %d\n";
      }
      else {
        if (local_4a4 != 0x1306b47) {
          local_478 = (void *)0x0;
          piStack_470 = (int *)0x0;
          local_468 = 4;
          local_460 = (long *)0x0;
          local_458 = 1;
          uStack_450 = 1;
          iStack_44c = 1;
          sVar6 = (size_t)w;
          local_454 = w;
          local_448 = sVar6;
          if (w == 0) {
            __return_storage_ptr__->data = (void *)0x0;
            __return_storage_ptr__->refcount = (int *)0x0;
            __return_storage_ptr__->elemsize = 4;
            __return_storage_ptr__->allocator = (Allocator *)0x0;
            __return_storage_ptr__->dims = 1;
            __return_storage_ptr__->w = 0;
            __return_storage_ptr__->h = 1;
            __return_storage_ptr__->c = 1;
            __return_storage_ptr__->cstep = sVar6;
          }
          else {
            local_4a0 = CONCAT44(local_4a0._4_4_,local_4a4 >> 0x18);
            pvVar5 = malloc(sVar6 * 4 + 0x1c);
            pvVar9 = (void *)((long)pvVar5 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar9 + -8) = pvVar5;
            piVar2 = (int *)((long)pvVar9 + sVar6 * 4);
            *piVar2 = 1;
            local_478 = pvVar9;
            piStack_470 = piVar2;
            if ((local_4a4 >> 8 & 0xff) + (local_4a4 & 0xff) + (local_4a4 >> 0x10 & 0xff) == 0 &&
                (int)local_4a0 == 0) {
              if ((char)local_4a4 == '\0') {
                sVar4 = fread(pvVar9,sVar6 << 2,1,(FILE *)this->binfp);
                uVar3 = (uint)sVar4;
                if (uVar3 != 1) {
                  pcVar7 = "ModelBin read weight_data failed %d\n";
                  goto LAB_00133565;
                }
              }
            }
            else {
              sVar4 = fread(local_438,0x400,1,(FILE *)this->binfp);
              uVar3 = (uint)sVar4;
              if (uVar3 != 1) {
                pcVar7 = "ModelBin read quantization_value failed %d\n";
LAB_00133565:
                fprintf(_stderr,pcVar7,(ulong)uVar3);
                __return_storage_ptr__->data = (void *)0x0;
                __return_storage_ptr__->refcount = (int *)0x0;
                __return_storage_ptr__->elemsize = 0;
                __return_storage_ptr__->allocator = (Allocator *)0x0;
                __return_storage_ptr__->dims = 0;
                __return_storage_ptr__->w = 0;
                __return_storage_ptr__->h = 0;
                __return_storage_ptr__->c = 0;
                __return_storage_ptr__->cstep = 0;
                goto LAB_00133614;
              }
              local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              uVar8 = (long)(w + 3) & 0xfffffffffffffffc;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_498,uVar8);
              sVar4 = fread(local_498.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,uVar8,1,(FILE *)this->binfp);
              if ((int)sVar4 == 1) {
                if (w < 1) goto LAB_001335bf;
                uVar8 = 0;
                do {
                  *(undefined4 *)((long)pvVar9 + uVar8 * 4) =
                       *(undefined4 *)
                        ((long)&local_438[0].
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start +
                        (ulong)local_498.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar8] * 4);
                  uVar8 = uVar8 + 1;
                } while ((uint)w != uVar8);
LAB_001335c4:
                operator_delete(local_498.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_498.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_498.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              else {
                fprintf(_stderr,"ModelBin read index_array failed %d\n",sVar4 & 0xffffffff);
                __return_storage_ptr__->data = (void *)0x0;
                __return_storage_ptr__->refcount = (int *)0x0;
                __return_storage_ptr__->elemsize = 0;
                __return_storage_ptr__->allocator = (Allocator *)0x0;
                __return_storage_ptr__->dims = 0;
                __return_storage_ptr__->w = 0;
                __return_storage_ptr__->h = 0;
                __return_storage_ptr__->c = 0;
                __return_storage_ptr__->cstep = 0;
LAB_001335bf:
                if (local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_001335c4;
              }
              if ((int)sVar4 != 1) goto LAB_00133614;
            }
            __return_storage_ptr__->data = pvVar9;
            __return_storage_ptr__->refcount = piVar2;
            __return_storage_ptr__->elemsize = 4;
            __return_storage_ptr__->allocator = (Allocator *)0x0;
            __return_storage_ptr__->dims = 1;
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
            __return_storage_ptr__->w = local_454;
            __return_storage_ptr__->h = uStack_450;
            __return_storage_ptr__->c = iStack_44c;
            __return_storage_ptr__->cstep = local_448;
          }
LAB_00133614:
          if (piStack_470 == (int *)0x0) {
            return __return_storage_ptr__;
          }
          LOCK();
          *piStack_470 = *piStack_470 + -1;
          UNLOCK();
          if (*piStack_470 != 0) {
            return __return_storage_ptr__;
          }
          if (local_460 != (long *)0x0) {
            (**(code **)(*local_460 + 8))();
            return __return_storage_ptr__;
          }
          if (local_478 == (void *)0x0) {
            return __return_storage_ptr__;
          }
          pvVar5 = *(void **)((long)local_478 + -8);
LAB_0013309c:
          free(pvVar5);
          return __return_storage_ptr__;
        }
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar8 = (long)(((ulong)(uint)w << 0x21) + 0x300000000) >> 0x20 & 0xfffffffffffffffc;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_438,uVar8);
        sVar4 = fread(local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,uVar8,1,(FILE *)this->binfp);
        uVar3 = (uint)sVar4;
        if (uVar3 == 1) {
          Mat::from_float16(__return_storage_ptr__,
                            (unsigned_short *)
                            local_438[0].
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start,w);
          goto LAB_001334fc;
        }
        pcVar7 = "ModelBin read float16_weights failed %d\n";
      }
      fprintf(_stderr,pcVar7,(ulong)uVar3);
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
LAB_001334fc:
      if ((unsigned_short *)
          local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start == (unsigned_short *)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_438[0].
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_438[0].
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start);
      return __return_storage_ptr__;
    }
    pcVar7 = "ModelBin read flag_struct failed %d\n";
    uVar8 = sVar4 & 0xffffffff;
  }
  else {
    pcVar7 = "ModelBin load type %d not implemented\n";
    uVar8 = (ulong)(uint)type;
  }
  fprintf(_stderr,pcVar7,uVar8);
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->elemsize = 0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
LAB_00132ff3:
  __return_storage_ptr__->cstep = 0;
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromStdio::load(int w, int type) const
{
    if (!binfp)
        return Mat();

    if (type == 0)
    {
        int nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = fread(&flag_struct, sizeof(flag_struct), 1, binfp);
        if (nread != 1)
        {
            fprintf(stderr, "ModelBin read flag_struct failed %d\n", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            int align_data_size = alignSize(w * sizeof(unsigned short), 4);
            std::vector<unsigned short> float16_weights;
            float16_weights.resize(align_data_size);
            nread = fread(float16_weights.data(), align_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read float16_weights failed %d\n", nread);
                return Mat();
            }

            return Mat::from_float16(float16_weights.data(), w);
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            int align_data_size = alignSize(w, 4);
            std::vector<signed char> int8_weights;
            int8_weights.resize(align_data_size);
            nread = fread(int8_weights.data(), align_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read int8_weights failed %d\n", nread);
                return Mat();
            }

            Mat m(w, (size_t)1u);
            if (m.empty())
                return m;

            memcpy(m.data, int8_weights.data(), w);

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            Mat m(w);
            if (m.empty())
                return m;

            // raw data with extra scaling
            nread = fread(m, w * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }

            return m;
        }

        Mat m(w);
        if (m.empty())
            return m;

        if (flag != 0)
        {
            // quantized data
            float quantization_value[256];
            nread = fread(quantization_value, 256 * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read quantization_value failed %d\n", nread);
                return Mat();
            }

            int align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = fread(index_array.data(), align_weight_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read index_array failed %d\n", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            nread = fread(m, w * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }
        }

        return m;
    }
    else if (type == 1)
    {
        Mat m(w);
        if (m.empty())
            return m;

        // raw data
        int nread = fread(m, w * sizeof(float), 1, binfp);
        if (nread != 1)
        {
            fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
            return Mat();
        }

        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}